

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  cmComputeLinkInformation *pcVar1;
  bool bVar2;
  iterator iVar3;
  tuple<cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_> this_00;
  pointer __old_p;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>,_bool>
  pVar4;
  __single_object info;
  string key;
  __uniq_ptr_impl<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_> local_48
  ;
  string local_40;
  
  cmsys::SystemTools::UpperCase(&local_40,config);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>_>
          ::find(&(this->LinkInformation)._M_t,&local_40);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header) {
    this_00.
    super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
    .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
          )operator_new(0x740);
    cmComputeLinkInformation::cmComputeLinkInformation
              ((cmComputeLinkInformation *)
               this_00.
               super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
               .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl,this,config);
    local_48._M_t.
    super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
    .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl =
         (tuple<cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>)
         (tuple<cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>)
         this_00.
         super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
         .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl;
    bVar2 = cmComputeLinkInformation::Compute
                      ((cmComputeLinkInformation *)
                       this_00.
                       super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
                       .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl);
    if (!bVar2) {
      local_48._M_t.
      super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
      .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl =
           (tuple<cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>)
           (_Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
            )0x0;
      cmComputeLinkInformation::~cmComputeLinkInformation
                ((cmComputeLinkInformation *)
                 this_00.
                 super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
                 .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl);
      operator_delete((void *)this_00.
                              super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
                              .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl
                      ,0x740);
    }
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
            ::
            _M_emplace_unique<std::__cxx11::string&,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
                        *)&this->LinkInformation,&local_40,
                       (unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
                        *)&local_48);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    if (*(cmComputeLinkInformation **)(iVar3._M_node + 2) != (cmComputeLinkInformation *)0x0) {
      CheckPropertyCompatibility(this,*(cmComputeLinkInformation **)(iVar3._M_node + 2),config);
    }
    std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>::
    ~unique_ptr((unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
                 *)&local_48);
  }
  pcVar1 = *(cmComputeLinkInformation **)(iVar3._M_node + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

cmComputeLinkInformation* cmGeneratorTarget::GetLinkInformation(
  const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  auto i = this->LinkInformation.find(key);
  if (i == this->LinkInformation.end()) {
    // Compute information for this configuration.
    auto info = cm::make_unique<cmComputeLinkInformation>(this, config);
    if (info && !info->Compute()) {
      info.reset();
    }

    // Store the information for this configuration.
    i = this->LinkInformation.emplace(key, std::move(info)).first;

    if (i->second) {
      this->CheckPropertyCompatibility(*i->second, config);
    }
  }
  return i->second.get();
}